

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O2

void icu_63::UnifiedCache::getByLocale<icu_63::SharedCalendar>
               (Locale *loc,SharedCalendar **ptr,UErrorCode *status)

{
  UnifiedCache *this;
  LocaleCacheKey<icu_63::SharedCalendar> LStack_118;
  
  this = getInstance(status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    LocaleCacheKey<icu_63::SharedCalendar>::LocaleCacheKey(&LStack_118,loc);
    get<icu_63::SharedCalendar>(this,&LStack_118.super_CacheKey<icu_63::SharedCalendar>,ptr,status);
    LocaleCacheKey<icu_63::SharedCalendar>::~LocaleCacheKey(&LStack_118);
  }
  return;
}

Assistant:

static void getByLocale(
           const Locale &loc, const T *&ptr, UErrorCode &status) {
       const UnifiedCache *cache = getInstance(status);
       if (U_FAILURE(status)) {
           return;
       }
       cache->get(LocaleCacheKey<T>(loc), ptr, status);
   }